

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::setTextureStorage
               (CallLogWrapper *glLog,TextureType imageType,deUint32 internalFormat,IVec3 *imageSize
               ,deUint32 textureBufGL)

{
  int iVar1;
  deUint32 target;
  int iVar2;
  TextureFormat format;
  
  target = getGLTextureTarget(imageType);
  if (TEXTURETYPE_CUBE < imageType) {
    if (imageType - TEXTURETYPE_2D_ARRAY < 2) {
      glu::CallLogWrapper::glTexStorage3D
                (glLog,target,1,internalFormat,imageSize->m_data[0],imageSize->m_data[1],
                 imageSize->m_data[2]);
    }
    else if (imageType == TEXTURETYPE_BUFFER) {
      format = glu::mapGLInternalFormat(internalFormat);
      iVar2 = tcu::TextureFormat::getPixelSize(&format);
      iVar1 = imageSize->m_data[0];
      glu::CallLogWrapper::glBindBuffer(glLog,0x8c2a,textureBufGL);
      glu::CallLogWrapper::glBufferData(glLog,0x8c2a,(long)(iVar2 * iVar1),(void *)0x0,0x88e4);
      glu::CallLogWrapper::glTexBuffer(glLog,0x8c2a,internalFormat,textureBufGL);
    }
    return;
  }
  glu::CallLogWrapper::glTexStorage2D
            (glLog,target,1,internalFormat,imageSize->m_data[0],imageSize->m_data[1]);
  return;
}

Assistant:

static void setTextureStorage (glu::CallLogWrapper& glLog, TextureType imageType, deUint32 internalFormat, const IVec3& imageSize, deUint32 textureBufGL)
{
	const deUint32 textureTarget = getGLTextureTarget(imageType);

	switch (imageType)
	{
		case TEXTURETYPE_BUFFER:
		{
			const TextureFormat		format		= glu::mapGLInternalFormat(internalFormat);
			const int				numBytes	= format.getPixelSize() * imageSize.x();
			DE_ASSERT(isFormatSupportedForTextureBuffer(format));
			glLog.glBindBuffer(GL_TEXTURE_BUFFER, textureBufGL);
			glLog.glBufferData(GL_TEXTURE_BUFFER, numBytes, DE_NULL, GL_STATIC_DRAW);
			glLog.glTexBuffer(GL_TEXTURE_BUFFER, internalFormat, textureBufGL);
			DE_ASSERT(imageSize.y() == 1 && imageSize.z() == 1);
			break;
		}

		// \note Fall-throughs.

		case TEXTURETYPE_2D:
		case TEXTURETYPE_CUBE:
			glLog.glTexStorage2D(textureTarget, 1, internalFormat, imageSize.x(), imageSize.y());
			DE_ASSERT(imageSize.z() == 1);
			break;

		case TEXTURETYPE_3D:
		case TEXTURETYPE_2D_ARRAY:
			glLog.glTexStorage3D(textureTarget, 1, internalFormat, imageSize.x(), imageSize.y(), imageSize.z());
			break;

		default:
			DE_ASSERT(false);
	}
}